

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_ARB1_const_array(Context *ctx,ConstantsList *clist,int base,int size)

{
  char *pcVar1;
  char local_f8 [8];
  char val3 [32];
  char val2 [32];
  char val1 [32];
  char val0 [32];
  int local_6c;
  char local_68 [4];
  int i;
  char varname [64];
  int size_local;
  int base_local;
  ConstantsList *clist_local;
  Context *ctx_local;
  
  get_ARB1_const_array_varname_in_buf(ctx,base,size,local_68,0x40);
  push_output(ctx,&ctx->globals);
  output_line(ctx,"PARAM %s[%d] = {",local_68,(ulong)(uint)size);
  ctx->indent = ctx->indent + 1;
  local_6c = 0;
  _size_local = clist;
  while( true ) {
    if (size <= local_6c) {
      ctx->indent = ctx->indent + -1;
      output_line(ctx,"};");
      pop_output(ctx);
      return;
    }
    for (; (_size_local->constant).type != MOJOSHADER_UNIFORM_FLOAT; _size_local = _size_local->next
        ) {
    }
    if ((_size_local->constant).index != base + local_6c) break;
    floatstr(ctx,val1 + 0x18,0x20,(_size_local->constant).value.f[0],1);
    floatstr(ctx,val2 + 0x18,0x20,(_size_local->constant).value.f[1],1);
    floatstr(ctx,val3 + 0x18,0x20,(_size_local->constant).value.f[2],1);
    floatstr(ctx,local_f8,0x20,(_size_local->constant).value.f[3],1);
    pcVar1 = "";
    if (local_6c < size + -1) {
      pcVar1 = ",";
    }
    output_line(ctx,"{ %s, %s, %s, %s }%s",val1 + 0x18,val2 + 0x18,val3 + 0x18,local_f8,pcVar1);
    _size_local = _size_local->next;
    local_6c = local_6c + 1;
  }
  __assert_fail("clist->constant.index == (base + i)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                ,0x1b99,"void emit_ARB1_const_array(Context *, const ConstantsList *, int, int)");
}

Assistant:

static void emit_ARB1_const_array(Context *ctx, const ConstantsList *clist,
                                  int base, int size)
{
    char varname[64];
    get_ARB1_const_array_varname_in_buf(ctx, base, size, varname, sizeof (varname));
    int i;

    push_output(ctx, &ctx->globals);
    output_line(ctx, "PARAM %s[%d] = {", varname, size);
    ctx->indent++;

    for (i = 0; i < size; i++)
    {
        while (clist->constant.type != MOJOSHADER_UNIFORM_FLOAT)
            clist = clist->next;
        assert(clist->constant.index == (base + i));

        char val0[32];
        char val1[32];
        char val2[32];
        char val3[32];
        floatstr(ctx, val0, sizeof (val0), clist->constant.value.f[0], 1);
        floatstr(ctx, val1, sizeof (val1), clist->constant.value.f[1], 1);
        floatstr(ctx, val2, sizeof (val2), clist->constant.value.f[2], 1);
        floatstr(ctx, val3, sizeof (val3), clist->constant.value.f[3], 1);

        output_line(ctx, "{ %s, %s, %s, %s }%s", val0, val1, val2, val3,
                    (i < (size-1)) ? "," : "");

        clist = clist->next;
    } // for

    ctx->indent--;
    output_line(ctx, "};");
    pop_output(ctx);
}